

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O2

void helper_sve_zip_p_aarch64(void *vd,void *vn,void *vm,uint32_t pred_desc)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  sbyte sVar7;
  uint n;
  ARMPredicateReg *__dest;
  int length;
  uint uVar8;
  int start;
  ulong uVar9;
  ARMPredicateReg tmp_m;
  ARMPredicateReg tmp_n;
  
  uVar3 = pred_desc & 0x1f;
  uVar2 = uVar3 + 2;
  uVar6 = (ulong)uVar2;
  n = pred_desc >> 10 & 3;
  uVar8 = pred_desc >> 0xc & 1;
  sVar7 = (sbyte)n;
  if (uVar3 < 7) {
    uVar5 = *vm;
    length = uVar2 * 4;
    start = uVar8 * length;
    uVar4 = extract64(*vn,start,length);
    uVar5 = extract64(uVar5,start,length);
    uVar4 = expand_bits(uVar4,n);
    uVar5 = expand_bits(uVar5,n);
    *(uint64_t *)vd = (uVar5 << ((byte)(1 << sVar7) & 0x3f)) + uVar4;
  }
  else {
    __dest = (ARMPredicateReg *)vn;
    if ((ulong)((long)vn - (long)vd) < uVar6) {
      __dest = &tmp_n;
      memcpy(__dest,vn,uVar6);
    }
    if ((ulong)((long)vm - (long)vd) < uVar6) {
      memcpy(&tmp_m,vm,uVar6);
      vm = &tmp_m;
    }
    uVar6 = 0;
    if (uVar8 != 0) {
      uVar6 = (ulong)(uVar2 >> 1);
    }
    if ((uVar6 & 3) == 0) {
      uVar6 = (ulong)((uint)uVar6 & 0xfffffffc);
      for (uVar9 = 0; uVar3 + 9 >> 3 != uVar9; uVar9 = uVar9 + 1) {
        uVar2 = *(uint *)((long)((ARMPredicateReg *)vm)->p + uVar9 * 4 + uVar6);
        uVar5 = expand_bits((ulong)*(uint *)((long)__dest->p + uVar9 * 4 + uVar6),n);
        uVar4 = expand_bits((ulong)uVar2,n);
        *(uint64_t *)((long)vd + uVar9 * 8) = (uVar4 << ((byte)(1 << sVar7) & 0x3f)) + uVar5;
      }
    }
    else {
      for (uVar9 = 0; uVar2 >> 1 != uVar9; uVar9 = uVar9 + 1) {
        bVar1 = *(byte *)((long)((ARMPredicateReg *)vm)->p + uVar9 + uVar6);
        uVar5 = expand_bits((ulong)*(byte *)((long)__dest->p + uVar9 + uVar6),n);
        uVar4 = expand_bits((ulong)bVar1,n);
        *(short *)((long)vd + uVar9 * 2) =
             (short)((int)uVar4 << ((byte)(1 << sVar7) & 0x1f)) + (short)uVar5;
      }
    }
  }
  return;
}

Assistant:

void HELPER(sve_zip_p)(void *vd, void *vn, void *vm, uint32_t pred_desc)
{
    intptr_t oprsz = extract32(pred_desc, 0, SIMD_OPRSZ_BITS) + 2;
    int esz = extract32(pred_desc, SIMD_DATA_SHIFT, 2);
    intptr_t high = extract32(pred_desc, SIMD_DATA_SHIFT + 2, 1);
    uint64_t *d = vd;
    intptr_t i;

    if (oprsz <= 8) {
        uint64_t nn = *(uint64_t *)vn;
        uint64_t mm = *(uint64_t *)vm;
        int half = 4 * oprsz;

        nn = extract64(nn, high * half, half);
        mm = extract64(mm, high * half, half);
        nn = expand_bits(nn, esz);
        mm = expand_bits(mm, esz);
        d[0] = nn + (mm << (1 << esz));
    } else {
        ARMPredicateReg tmp_n, tmp_m;

        /* We produce output faster than we consume input.
           Therefore we must be mindful of possible overlap.  */
        if (((char *)vn - (char *)vd) < (uintptr_t)oprsz) {
            vn = memcpy(&tmp_n, vn, oprsz);
        }
        if (((char *)vm - (char *)vd) < (uintptr_t)oprsz) {
            vm = memcpy(&tmp_m, vm, oprsz);
        }
        if (high) {
            high = oprsz >> 1;
        }

        if ((high & 3) == 0) {
            uint32_t *n = vn, *m = vm;
            high >>= 2;

            for (i = 0; i < DIV_ROUND_UP(oprsz, 8); i++) {
                uint64_t nn = n[H4(high + i)];
                uint64_t mm = m[H4(high + i)];

                nn = expand_bits(nn, esz);
                mm = expand_bits(mm, esz);
                d[i] = nn + (mm << (1 << esz));
            }
        } else {
            uint8_t *n = vn, *m = vm;
            uint16_t *d16 = vd;

            for (i = 0; i < oprsz / 2; i++) {
                uint16_t nn = n[H1(high + i)];
                uint16_t mm = m[H1(high + i)];

                nn = expand_bits(nn, esz);
                mm = expand_bits(mm, esz);
                d16[H2(i)] = nn + (mm << (1 << esz));
            }
        }
    }
}